

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_3d.hpp
# Opt level: O2

cartesian_cubic<float> *
sisl::io::read_raw_file<float>
          (int *rx,int *ry,int *rz,string *file,e_datatype *type,bool *swap_endian)

{
  undefined4 uVar1;
  double dVar2;
  byte bVar3;
  bool bVar4;
  ushort uVar5;
  uint uVar6;
  uint uVar7;
  char cVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  void *pvVar12;
  cartesian_cubic<float> *this;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined8 *puVar13;
  ushort uVar14;
  int k;
  int iVar15;
  ulong uVar16;
  int i;
  uint uVar17;
  int j;
  uint uVar18;
  ifstream fp;
  int aiStack_218 [122];
  
  std::ifstream::ifstream(&fp,(file->_M_dataplus)._M_p,_S_in|_S_bin|_S_ate);
  if ((*(int *)((long)aiStack_218 + *(long *)(_fp + -0x18)) == 0) &&
     (cVar8 = std::__basic_file<char>::is_open(), cVar8 != '\0')) {
    uVar11 = std::istream::tellg();
    std::istream::seekg((long)&fp,_S_beg);
    uVar16 = 0xffffffffffffffff;
    if (-1 < (long)uVar11) {
      uVar16 = uVar11;
    }
    pvVar12 = operator_new__(uVar16);
    std::istream::read((char *)&fp,(long)pvVar12);
    this = (cartesian_cubic<float> *)operator_new(0x68);
    cartesian_cubic<float>::cartesian_cubic(this,*rx - 1,*ry - 1,*rz - 1);
    uVar16 = (ulong)(uint)*type;
    switch(uVar16) {
    case 0:
      while (iVar15 = (int)uVar16, iVar15 < *rx) {
        for (uVar17 = 0; (int)uVar17 < *ry; uVar17 = uVar17 + 1) {
          uVar11 = 0;
          while (iVar10 = (int)uVar11, iVar10 < *rz) {
            bVar3 = *(byte *)((long)pvVar12 + (long)(int)((*ry * iVar10 + uVar17) * *rx + iVar15));
            iVar9 = (**(this->super_base_lattice<float>)._vptr_base_lattice)
                              (this,uVar16,(ulong)uVar17,uVar11);
            *(float *)CONCAT44(extraout_var,iVar9) = (float)bVar3;
            uVar11 = (ulong)(iVar10 + 1);
          }
        }
        uVar16 = (ulong)(iVar15 + 1);
      }
      break;
    case 1:
      for (uVar17 = 0; (int)uVar17 < *rx; uVar17 = uVar17 + 1) {
        for (uVar18 = 0; (int)uVar18 < *ry; uVar18 = uVar18 + 1) {
          uVar16 = 0;
          while (iVar15 = (int)uVar16, iVar15 < *rz) {
            uVar5 = *(ushort *)
                     ((long)pvVar12 + (long)(int)((*ry * iVar15 + uVar18) * *rx + uVar17) * 2);
            bVar4 = *swap_endian;
            iVar10 = (**(this->super_base_lattice<float>)._vptr_base_lattice)
                               (this,(ulong)uVar17,(ulong)uVar18,uVar16);
            uVar14 = uVar5 << 8 | uVar5 >> 8;
            if (bVar4 == false) {
              uVar14 = uVar5;
            }
            *(float *)CONCAT44(extraout_var_03,iVar10) = (float)uVar14;
            uVar16 = (ulong)(iVar15 + 1);
          }
        }
      }
      break;
    case 2:
      for (uVar17 = 0; (int)uVar17 < *rx; uVar17 = uVar17 + 1) {
        for (uVar18 = 0; (int)uVar18 < *ry; uVar18 = uVar18 + 1) {
          uVar16 = 0;
          while (iVar15 = (int)uVar16, iVar15 < *rz) {
            uVar6 = *(uint *)((long)pvVar12 +
                             (long)(int)((*ry * iVar15 + uVar18) * *rx + uVar17) * 4);
            bVar4 = *swap_endian;
            iVar10 = (**(this->super_base_lattice<float>)._vptr_base_lattice)
                               (this,(ulong)uVar17,(ulong)uVar18,uVar16);
            uVar7 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
            if (bVar4 == false) {
              uVar7 = uVar6;
            }
            *(float *)CONCAT44(extraout_var_01,iVar10) = (float)uVar7;
            uVar16 = (ulong)(iVar15 + 1);
          }
        }
      }
      break;
    case 3:
      for (uVar17 = 0; (int)uVar17 < *rx; uVar17 = uVar17 + 1) {
        for (uVar18 = 0; (int)uVar18 < *ry; uVar18 = uVar18 + 1) {
          uVar16 = 0;
          while (iVar15 = (int)uVar16, iVar15 < *rz) {
            uVar1 = *(undefined4 *)
                     ((long)pvVar12 + (long)(int)((*ry * iVar15 + uVar18) * *rx + uVar17) * 4);
            iVar10 = (**(this->super_base_lattice<float>)._vptr_base_lattice)
                               (this,(ulong)uVar17,(ulong)uVar18,uVar16);
            *(undefined4 *)CONCAT44(extraout_var_02,iVar10) = uVar1;
            uVar16 = (ulong)(iVar15 + 1);
          }
        }
      }
      break;
    case 4:
      for (uVar17 = 0; (int)uVar17 < *rx; uVar17 = uVar17 + 1) {
        for (uVar18 = 0; (int)uVar18 < *ry; uVar18 = uVar18 + 1) {
          uVar16 = 0;
          while (iVar15 = (int)uVar16, iVar15 < *rz) {
            dVar2 = *(double *)
                     ((long)pvVar12 + (long)(int)((*ry * iVar15 + uVar18) * *rx + uVar17) * 8);
            iVar10 = (**(this->super_base_lattice<float>)._vptr_base_lattice)
                               (this,(ulong)uVar17,(ulong)uVar18,uVar16);
            *(float *)CONCAT44(extraout_var_00,iVar10) = (float)dVar2;
            uVar16 = (ulong)(iVar15 + 1);
          }
        }
      }
      break;
    default:
      puVar13 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar13 = "Unknown datatype passed to sisl::io::read_raw_file()!";
      __cxa_throw(puVar13,&char_const*::typeinfo,0);
    }
    operator_delete__(pvVar12);
  }
  else {
    this = (cartesian_cubic<float> *)0x0;
  }
  std::ifstream::~ifstream(&fp);
  return this;
}

Assistant:

inline cartesian_cubic<O>
       *read_raw_file(const int &rx, const int &ry, const int &rz,
                      const std::string &file, 
                      const e_datatype &type,
                      const bool &swap_endian = false) {
    using namespace std;

    // Define this to help indexing the raw data
    #define INDEX(i,j,k)  i + rx * ( j + ry*k )

    // Open the file
    ifstream fp(file.c_str(), ios::in | ios::binary | ios::ate);
    streampos size;

    if (!fp.good() || !fp.is_open()) return nullptr;
    size = fp.tellg();
    fp.seekg(0, ios::beg);

    // Allocate and Read
    char *buffer = new char[size];
    fp.read(buffer, size);

    // Allocate the array
    cartesian_cubic<O> *lattice = new cartesian_cubic<O>(rx-1, ry-1, rz-1);

    switch (type) {
        case SDT_UINT8:
        {
            unsigned char *l_buff = (unsigned char *)buffer;
            #pragma omp parallel for
            for(int i = 0; i < rx; i++)
                for(int j = 0; j < ry; j++)
                    for(int k = 0; k < rz; k++)
                        (*lattice)(i,j,k) = (O)l_buff[INDEX(i,j,k)];
            break;
        }
        case SDT_UINT16:
        {
            unsigned short *l_buff = (unsigned short *)buffer;
            #pragma omp parallel for
            for(int i = 0; i < rx; i++)
                for(int j = 0; j < ry; j++)
                    for(int k = 0; k < rz; k++) {
                        uint16_t data = l_buff[INDEX(i,j,k)];

                        (*lattice)(i,j,k) = (O)(swap_endian ? SWAP_16(data) : data); 
                    }
            break;
        }
        case SDT_UINT32:
        {
            unsigned int *l_buff = (unsigned int *)buffer;
            #pragma omp parallel for
            for(int i = 0; i < rx; i++)
                for(int j = 0; j < ry; j++)
                    for(int k = 0; k < rz; k++) {
                        uint32_t data = l_buff[INDEX(i,j,k)];
                        (*lattice)(i,j,k) = (O)(swap_endian ? SWAP_32(data) : data); 
                    }
            break;
        }
        case SDT_FLOAT:
        {
            float *l_buff = (float *)buffer;
            #pragma omp parallel for
            for(int i = 0; i < rx; i++)
                for(int j = 0; j < ry; j++)
                    for(int k = 0; k < rz; k++)
                        (*lattice)(i,j,k) = (O)l_buff[INDEX(i,j,k)];
            break;
        }
        case SDT_DOUBLE:
        {
            double *l_buff = (double *)buffer;
            #pragma omp parallel for
            for(int i = 0; i < rx; i++)
                for(int j = 0; j < ry; j++)
                    for(int k = 0; k < rz; k++)
                        (*lattice)(i,j,k) = (O)l_buff[INDEX(i,j,k)];
            break;
        }
        default:
            throw "Unknown datatype passed to sisl::io::read_raw_file()!";
    }
    delete[] buffer;
    #undef INDEX

    return lattice;
}